

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O0

bool iDynTree::URDFFromModel(Model *model,string *urdf_filename,ModelExporterOptions *options)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  ostream *poVar4;
  ModelExporterOptions *in_RDX;
  string *in_RSI;
  ModelExporterOptions *in_RDI;
  string xml_string;
  ofstream ofs;
  ModelExporterOptions *in_stack_00000148;
  string *in_stack_00000150;
  Model *in_stack_00000158;
  ModelExporterOptions *this;
  string local_250 [32];
  undefined4 local_230;
  ModelExporterOptions local_220 [5];
  string *local_18;
  ModelExporterOptions *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar3 = std::__cxx11::string::c_str();
  this = local_220;
  std::ofstream::ofstream(this,uVar3,0x10);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "[ERROR] iDynTree::URDFFromModel : error opening file ");
    poVar4 = std::operator<<(poVar4,local_18);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
    local_230 = 1;
  }
  else {
    std::__cxx11::string::string(local_250);
    ModelExporterOptions::ModelExporterOptions(this,in_RDX);
    bVar2 = URDFStringFromModel(in_stack_00000158,in_stack_00000150,in_stack_00000148);
    ModelExporterOptions::~ModelExporterOptions(local_10);
    local_1 = ((bVar2 ^ 0xffU) & 1) == 0;
    if ((bool)local_1) {
      std::operator<<((ostream *)local_220,local_250);
      std::ofstream::close();
    }
    local_230 = 1;
    std::__cxx11::string::~string(local_250);
  }
  std::ofstream::~ofstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool URDFFromModel(const iDynTree::Model & model,
                   const std::string & urdf_filename,
                   const ModelExporterOptions options)
{
    std::ofstream ofs(urdf_filename.c_str());

    if( !ofs.is_open() )
    {
        std::cerr << "[ERROR] iDynTree::URDFFromModel : error opening file "
                  << urdf_filename << std::endl;
        return false;
    }

    std::string xml_string;
    if (!URDFStringFromModel(model, xml_string, options))
    {
        return false;
    }

    // Write string to file
    ofs << xml_string;
    ofs.close();

    return true;
}